

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobject.cpp
# Opt level: O2

void __thiscall DObject::~DObject(DObject *this)

{
  DObject *pDVar1;
  DObject **ppDVar2;
  PClass *this_00;
  DObject **ppDVar3;
  
  this->_vptr_DObject = (_func_int **)&PTR_StaticType_006ecf30;
  if (PClass::bShutdown == false) {
    this_00 = GetClass(this);
    if (((this->ObjectFlags & 0x40) == 0) && (PClass::bShutdown == false)) {
      if (-1 < (char)this->ObjectFlags) {
        Printf("Warning: \'%s\' is freed outside the GC process.\n");
      }
      StaticPointerSubstitution(this,(DObject *)0x0,false);
      ppDVar2 = (DObject **)&GC::Root;
      do {
        ppDVar3 = ppDVar2;
        pDVar1 = *ppDVar3;
        if (pDVar1 == (DObject *)0x0) goto LAB_003910f9;
        ppDVar2 = &pDVar1->ObjNext;
      } while (pDVar1 != this);
      *ppDVar3 = this->ObjNext;
      if (&this->ObjNext == GC::SweepPos) {
        GC::SweepPos = ppDVar3;
      }
LAB_003910f9:
      if ((this->ObjectFlags & 7) == 0) {
        ppDVar2 = (DObject **)&GC::Gray;
        do {
          ppDVar3 = ppDVar2;
          pDVar1 = *ppDVar3;
          if (pDVar1 == (DObject *)0x0) goto LAB_00391121;
          ppDVar2 = &pDVar1->GCNext;
        } while (pDVar1 != this);
        *ppDVar3 = this->GCNext;
      }
    }
LAB_00391121:
    if (this_00 != (PClass *)0x0) {
      PClass::DestroySpecials(this_00,this);
    }
  }
  return;
}

Assistant:

DObject::~DObject ()
{
	if (!PClass::bShutdown)
	{
		PClass *type = GetClass();
		if (!(ObjectFlags & OF_Cleanup) && !PClass::bShutdown)
		{
			DObject **probe;

			if (!(ObjectFlags & OF_YesReallyDelete))
			{
				Printf("Warning: '%s' is freed outside the GC process.\n",
					type != NULL ? type->TypeName.GetChars() : "==some object==");
			}

			// Find all pointers that reference this object and NULL them.
			StaticPointerSubstitution(this, NULL);

			// Now unlink this object from the GC list.
			for (probe = &GC::Root; *probe != NULL; probe = &((*probe)->ObjNext))
			{
				if (*probe == this)
				{
					*probe = ObjNext;
					if (&ObjNext == GC::SweepPos)
					{
						GC::SweepPos = probe;
					}
					break;
				}
			}

			// If it's gray, also unlink it from the gray list.
			if (this->IsGray())
			{
				for (probe = &GC::Gray; *probe != NULL; probe = &((*probe)->GCNext))
				{
					if (*probe == this)
					{
						*probe = GCNext;
						break;
					}
				}
			}
		}
		
		if (nullptr != type)
		{
			type->DestroySpecials(this);
		}
	}
}